

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::insertfile(Fl_Text_Buffer *this,char *file,int pos,int buflen)

{
  int iVar1;
  FILE *__stream;
  char *buffer_00;
  int e;
  int l;
  char line [100];
  char *endline;
  char *buffer;
  FILE *fp;
  int buflen_local;
  int pos_local;
  char *file_local;
  Fl_Text_Buffer *this_local;
  
  __stream = (FILE *)fl_fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    buffer_00 = (char *)operator_new__((long)(buflen + 1));
    this->input_file_was_transcoded = 0;
    unique0x00004880 = &e;
    fp._4_4_ = pos;
    while (iVar1 = utf8_input_filter(buffer_00,buflen,(char *)&e,100,(char **)(line + 0x60),
                                     (FILE *)__stream,&this->input_file_was_transcoded), iVar1 != 0)
    {
      buffer_00[iVar1] = '\0';
      insert(this,fp._4_4_,buffer_00);
      fp._4_4_ = iVar1 + fp._4_4_;
    }
    iVar1 = ferror(__stream);
    this_local._4_4_ = 0;
    if (iVar1 != 0) {
      this_local._4_4_ = 2;
    }
    fclose(__stream);
    if (buffer_00 != (char *)0x0) {
      operator_delete__(buffer_00);
    }
    if (((this_local._4_4_ == 0) && (this->input_file_was_transcoded != 0)) &&
       (this->transcoding_warning_action != (_func_void_Fl_Text_Buffer_ptr *)0x0)) {
      (*this->transcoding_warning_action)(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Buffer::insertfile(const char *file, int pos, int buflen)
{
  FILE *fp;
  if (!(fp = fl_fopen(file, "r")))
    return 1;
  char *buffer = new char[buflen + 1];  
  char *endline, line[100];
  int l;
  input_file_was_transcoded = false;
  endline = line;
  while (true) {
#ifdef EXAMPLE_ENCODING
    // example of 16-bit encoding: UTF-16
    l = general_input_filter(buffer, buflen, 
				  line, sizeof(line), endline, 
				  utf16toucs, // use cp1252toucs to read CP1252-encoded files
				  fp);
    input_file_was_transcoded = true;
#else
    l = utf8_input_filter(buffer, buflen, line, sizeof(line), endline, 
			  fp, &input_file_was_transcoded);
#endif
    if (l == 0) break;
    buffer[l] = 0;
    insert(pos, buffer);
    pos += l;
  }
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  delete[]buffer;
  if ( (!e) && input_file_was_transcoded && transcoding_warning_action) {
    transcoding_warning_action(this);
  }
  return e;
}